

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsBrokerSendOrderedCommand(HelicsBroker broker,char *target,char *command,HelicsError *err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_RDX;
  long in_RSI;
  Broker *brk;
  HelicsError *in_stack_ffffffffffffffb0;
  __sv_type in_stack_ffffffffffffffb8;
  __sv_type local_38;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         getBroker((HelicsBroker)in_stack_ffffffffffffffb8._M_len,in_stack_ffffffffffffffb0);
  if (this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (in_RSI == 0) {
      local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_ffffffffffffffb8._M_str,(char *)in_stack_ffffffffffffffb8._M_len);
    }
    if (in_RDX == 0) {
      in_stack_ffffffffffffffb8 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_ffffffffffffffb8._M_str,(char *)in_stack_ffffffffffffffb8._M_len);
    }
    (**(code **)((this->_M_dataplus)._M_p + 0x98))
              (this,local_38._M_len,local_38._M_str,in_stack_ffffffffffffffb8._M_len,
               in_stack_ffffffffffffffb8._M_str,1);
  }
  return;
}

Assistant:

void helicsBrokerSendOrderedCommand(HelicsBroker broker, const char* target, const char* command, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    brk->sendCommand(AS_STRING_VIEW(target), AS_STRING_VIEW(command), HELICS_SEQUENCING_MODE_ORDERED);
}